

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O3

int read_operands_table(Dwarf_Macro_Context macro_context,Dwarf_Small *macro_header,
                       Dwarf_Small *macro_data,Dwarf_Small *section_base,Dwarf_Unsigned section_size
                       ,Dwarf_Unsigned *table_size_out,Dwarf_Error *error)

{
  byte bVar1;
  Dwarf_Debug dbg;
  Dwarf_Small *endptr;
  int iVar2;
  Dwarf_Macro_Forms_s *pDVar3;
  ushort uVar4;
  char *msg;
  ulong uVar5;
  Dwarf_Small *pDVar6;
  Dwarf_Signed DVar7;
  uint uVar8;
  Dwarf_Small *pDVar9;
  Dwarf_Small _ltmp;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned local_78;
  Dwarf_Small *local_70;
  Dwarf_Small *local_68;
  Dwarf_Unsigned local_60;
  Dwarf_Macro_Forms_s *local_58;
  ulong local_50;
  int local_44;
  Dwarf_Small *local_40;
  Dwarf_Unsigned *local_38;
  
  dbg = macro_context->mc_dbg;
  if (macro_context->mc_sentinel == 0xada) {
    pDVar6 = macro_data + 1;
    if ((ulong)((long)pDVar6 - (long)macro_header) < section_size) {
      local_78 = local_78 & 0xffffffffffffff00;
      if (macro_context->mc_macro_header + macro_context->mc_total_length < pDVar6) {
        msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
        DVar7 = 0x14b;
        goto LAB_001759bf;
      }
      local_70 = pDVar6;
      local_68 = section_base;
      local_40 = macro_context->mc_macro_header + macro_context->mc_total_length;
      (*dbg->de_copy_word)(&local_78,macro_data,1);
      uVar5 = local_78 & 0xff;
      local_50 = uVar5;
      if (local_70 + (uVar5 * 4 - (long)local_68) < section_size) {
        local_58 = (Dwarf_Macro_Forms_s *)CONCAT71(local_58._1_7_,(byte)local_78);
        pDVar6 = local_70;
        local_38 = table_size_out;
        if ((byte)local_78 != '\0') {
          do {
            pDVar6 = pDVar6 + 1;
            local_78 = 0;
            local_60 = 0;
            iVar2 = dwarf_decode_leb128((char *)pDVar6,&local_78,&local_60,(char *)local_40);
            if (iVar2 == 1) goto LAB_00175bfe;
            if (section_size <= (ulong)((long)(pDVar6 + local_60 + local_78) - (long)local_68))
            goto LAB_00175bf7;
            uVar8 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar8;
            pDVar6 = pDVar6 + local_60 + local_78;
          } while (uVar8 != 0);
        }
        pDVar3 = (Dwarf_Macro_Forms_s *)calloc(local_50,0x10);
        macro_context->mc_opcode_forms = pDVar3;
        macro_context->mc_opcode_count = (Dwarf_Small)local_58;
        if (pDVar3 != (Dwarf_Macro_Forms_s *)0x0) {
          pDVar6 = local_70;
          if ((Dwarf_Small)local_58 != '\0') {
            iVar2 = 0;
            do {
              endptr = local_40;
              if (section_size <= pDVar6 + (2 - (long)local_68)) goto LAB_00175bf7;
              local_78 = local_78 & 0xffffffffffffff00;
              pDVar9 = pDVar6 + 1;
              local_58 = pDVar3;
              if (local_40 < pDVar9) {
                msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
                DVar7 = 0x14b;
                goto LAB_001759bf;
              }
              local_44 = iVar2;
              (*dbg->de_copy_word)(&local_78,pDVar6,1);
              bVar1 = (byte)local_78;
              local_78 = 0;
              local_60 = 0;
              iVar2 = dwarf_decode_leb128((char *)pDVar9,&local_78,&local_60,(char *)endptr);
              pDVar3 = local_58;
              if (iVar2 == 1) goto LAB_00175bfe;
              pDVar9 = pDVar9 + local_78;
              local_58->mf_code = bVar1;
              local_58->mf_formcount = (Dwarf_Small)local_60;
              pDVar6 = pDVar9 + local_60;
              if (section_size <= (ulong)((long)pDVar6 - (long)local_68)) goto LAB_00175bf7;
              local_58->mf_formbytes = pDVar9;
              if (local_60 != 0 && 0xc < bVar1) {
                uVar4 = 1;
                uVar5 = 0;
                do {
                  bVar1 = pDVar9[uVar5];
                  if ((0xc < bVar1 - 3) &&
                     ((0x1e < bVar1 || ((0x44800000U >> (bVar1 & 0x1f) & 1) == 0)))) {
                    DVar7 = 0x144;
                    goto LAB_00175bde;
                  }
                  uVar5 = (ulong)uVar4;
                  uVar4 = uVar4 + 1;
                } while (uVar5 < local_60);
              }
              iVar2 = validate_opcode(macro_context->mc_dbg,local_58,error);
              if (iVar2 != 0) {
                return 1;
              }
              iVar2 = local_44 + 1;
              pDVar3 = pDVar3 + 1;
            } while (iVar2 != (int)local_50);
          }
          *local_38 = (long)pDVar6 - (long)local_70;
          return 0;
        }
        DVar7 = 0x3e;
        goto LAB_00175bde;
      }
    }
    DVar7 = 0x13e;
    goto LAB_00175bde;
  }
  msg = "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header";
  DVar7 = 0x142;
  goto LAB_001759bf;
LAB_00175bf7:
  DVar7 = 0x13e;
LAB_00175bde:
  _dwarf_error(dbg,error,DVar7);
  return 1;
LAB_00175bfe:
  msg = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
  DVar7 = 0x149;
LAB_001759bf:
  _dwarf_error_string(dbg,error,DVar7,msg);
  return 1;
}

Assistant:

static int
read_operands_table(Dwarf_Macro_Context macro_context,
    Dwarf_Small * macro_header,
    Dwarf_Small * macro_data,
    Dwarf_Small * section_base,
    Dwarf_Unsigned section_size,
    Dwarf_Unsigned *table_size_out,
    Dwarf_Error *error)
{
    Dwarf_Small* table_data_start = macro_data;
    Dwarf_Unsigned local_size = 0;
    Dwarf_Unsigned cur_offset = 0;
    Dwarf_Small operand_table_count = 0;
    unsigned i = 0;
    struct Dwarf_Macro_Forms_s *curformentry = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Byte_Ptr startptr = 0;
    Dwarf_Byte_Ptr endptr = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    cur_offset = (1+ macro_data) - macro_header;
    if (cur_offset >= section_size) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
        return DW_DLV_ERROR;
    }

    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    READ_UNALIGNED_CK(dbg,operand_table_count,Dwarf_Small,
        macro_data,sizeof(Dwarf_Small),error,endptr);
    macro_data += sizeof(Dwarf_Small);
    /* Estimating minimum size */
    local_size = operand_table_count * 4;

    cur_offset = (local_size+ macro_data) - section_base;
    if (cur_offset >= section_size) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
        return DW_DLV_ERROR;
    }
    /* first, get size of table. */
    table_data_start = macro_data;
    for (i = 0; i < operand_table_count; ++i) {
        /*  Compiler warning about unused opcode_number
            variable should be ignored. */
        Dwarf_Unsigned formcount = 0;
#if 0   /* No need to actually read, just update pointer*/
        Dwarf_Small opcode_number = 0;
        READ_UNALIGNED_CK(dbg,opcode_number,Dwarf_Small,
            macro_data,sizeof(Dwarf_Small),error,endptr);
#endif /*0*/
        macro_data += sizeof(Dwarf_Small);

        DECODE_LEB128_UWORD_CK(macro_data,formcount,
            dbg, error, endptr);
        cur_offset = (formcount+ macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        /* The 1 ubyte forms follow. Step past them. */
        macro_data += formcount;
    }
    /* reset for reread. */
    macro_data = table_data_start;
    /* allocate table */
    macro_context->mc_opcode_forms =  (struct Dwarf_Macro_Forms_s *)
        calloc(operand_table_count,
            sizeof(struct Dwarf_Macro_Forms_s));
    macro_context->mc_opcode_count = operand_table_count;
    if (!macro_context->mc_opcode_forms) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    curformentry = macro_context->mc_opcode_forms;
    for (i = 0; i < operand_table_count; ++i,++curformentry) {
        Dwarf_Small opcode_number = 0;
        Dwarf_Unsigned formcount = 0;
        int res = 0;

        cur_offset = (2 + macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        READ_UNALIGNED_CK(dbg,opcode_number,Dwarf_Small,
            macro_data,sizeof(Dwarf_Small),
            error,endptr);
        macro_data += sizeof(Dwarf_Small);
        DECODE_LEB128_UWORD_CK(macro_data,formcount,
            dbg, error, endptr);

        curformentry->mf_code = opcode_number;
        curformentry->mf_formcount = (Dwarf_Small)formcount;

        cur_offset = (formcount+ macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        curformentry->mf_formbytes = macro_data;
        macro_data += formcount;
        if (opcode_number  > DW_MACRO_undef_strx ) {
            Dwarf_Half k = 0;
            for (k = 0; k < formcount; ++k) {
                if (!valid_macro_form(
                    curformentry->mf_formbytes[k])) {
                    _dwarf_error(dbg, error,
                        DW_DLE_MACRO_OP_UNHANDLED);
                    return DW_DLV_ERROR;
                }
            }
        }
        res = validate_opcode(macro_context->mc_dbg,
            curformentry, error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    *table_size_out = macro_data - table_data_start;
    return DW_DLV_OK;
}